

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_14::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,
          vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *filllist)

{
  exr_result_t eVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  IoExc *this_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int *in_RDI;
  exr_chunk_info_t *in_R8;
  stringstream _iex_throw_s;
  uint8_t flags;
  exr_attr_box2i_t dw;
  int tileY;
  int tileX;
  int absY;
  int absX;
  exr_attr_box2i_t *in_stack_fffffffffffffdc8;
  exr_decode_pipeline_t *in_stack_fffffffffffffdd0;
  exr_const_context_t in_stack_fffffffffffffdd8;
  int32_t *in_stack_fffffffffffffde0;
  int part_index;
  exr_const_context_t in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  exr_const_context_t in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  DeepFrameBuffer *in_stack_fffffffffffffe28;
  TileProcess *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  DeepFrameBuffer *in_stack_fffffffffffffe48;
  TileProcess *in_stack_fffffffffffffe50;
  exr_decode_pipeline_t *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  exr_const_context_t in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  DeepFrameBuffer *in_stack_fffffffffffffe98;
  TileProcess *in_stack_fffffffffffffea0;
  vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *in_stack_fffffffffffffeb0;
  byte local_49;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    eVar1 = exr_decoding_update(in_stack_fffffffffffffde8,
                                (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                                (exr_chunk_info_t *)in_stack_fffffffffffffdd8,
                                in_stack_fffffffffffffdd0);
    if (eVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::IoExc::IoExc((IoExc *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      __cxa_throw(uVar2,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
    }
    local_49 = (byte)*(undefined2 *)((long)in_RDI + 0x5a);
  }
  else {
    eVar1 = exr_decoding_initialize
                      ((exr_const_context_t)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       (int)((ulong)in_RCX >> 0x20),in_R8,
                       (exr_decode_pipeline_t *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (eVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::IoExc::IoExc((IoExc *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      __cxa_throw(uVar2,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
    }
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 2;
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 1;
    local_49 = 0;
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  eVar1 = exr_get_data_window(in_stack_fffffffffffffdd8,
                              (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                              in_stack_fffffffffffffdc8);
  if (eVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  eVar1 = exr_get_tile_sizes(in_stack_fffffffffffffdf8,
                             (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                             (int)in_stack_fffffffffffffdf0,
                             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                             in_stack_fffffffffffffde0,(int32_t *)in_stack_fffffffffffffdd8);
  part_index = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  if (eVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if ((*(byte *)((long)in_RDI + 5) & 1) == 0) {
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) & 0xfffb;
  }
  else {
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 4;
  }
  update_pointers(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                  in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
  if (((ushort)local_49 != *(ushort *)((long)in_RDI + 0x5a)) &&
     (eVar1 = exr_decoding_choose_default_routines
                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe60), eVar1 != 0)) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::IoExc::IoExc((IoExc *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    __cxa_throw(uVar2,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
  }
  eVar1 = exr_decoding_run(in_stack_fffffffffffffde8,part_index,
                           (exr_decode_pipeline_t *)in_stack_fffffffffffffdd8);
  *in_RDI = eVar1;
  if (*in_RDI == 0) {
    copy_sample_count(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                      in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
    ;
    if ((*(byte *)((long)in_RDI + 5) & 1) == 0) {
      run_fill(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffeb0);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe18);
  poVar3 = std::operator<<((ostream *)&stack0xfffffffffffffe28,"Unable to run decoder: ");
  pcVar4 = exr_get_error_code_as_string(*in_RDI);
  std::operator<<(poVar3,pcVar4);
  this_00 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::IoExc::IoExc(this_00,(stringstream *)in_stack_fffffffffffffdc8);
  __cxa_throw(this_00,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    const std::vector<DeepSlice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;
    uint8_t flags;

    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }
        decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
        decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
        flags = 0;

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
        flags = decoder.decode_flags;
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;
    else
        decoder.decode_flags = decoder.decode_flags & ~EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (flags != decoder.decode_flags)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
    {
        THROW (
            IEX_NAMESPACE::IoExc,
            "Unable to run decoder: "
            << exr_get_error_code_as_string (last_decode_err));
    }

    copy_sample_count (outfb, dw.min.x, dw.min.y, absX, absY);

    if (counts_only)
        return;

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}